

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Status_set_elements_x(MPIABI_Status *status,MPIABI_Datatype datatype,MPIABI_Count count)

{
  int iVar1;
  MPI_Status *mpi_status_ptr;
  
  iVar1 = MPI_Status_set_elements_x();
  if (status != (MPIABI_Status *)0x0) {
    status->MPI_SOURCE = (int)*(undefined8 *)&status->mpi_status;
    status->MPI_TAG = (int)((ulong)*(undefined8 *)&status->mpi_status >> 0x20);
    status->MPI_ERROR = (status->mpi_status).status_OpenMPI.f2;
  }
  return iVar1;
}

Assistant:

int MPIABI_Status_set_elements_x(
  MPIABI_Status * status,
  MPIABI_Datatype datatype,
  MPIABI_Count count
) {
  return MPI_Status_set_elements_x(
    (MPI_Status *)(WPI_StatusPtr)status,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Count)(WPI_Count)count
  );
}